

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

string * __thiscall
spvtools::opt::analysis::TensorLayoutNV::str_abi_cxx11_
          (string *__return_storage_ptr__,TensorLayoutNV *this)

{
  ostream *poVar1;
  ostringstream oss;
  ostringstream aoStack_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_198,"<",1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)aoStack_198);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,">",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string TensorLayoutNV::str() const {
  std::ostringstream oss;
  oss << "<" << dim_id_ << ", " << clamp_mode_id_ << ">";
  return oss.str();
}